

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_NtkFindSupp3(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int local_74;
  int NodeMark;
  int *pFanins3;
  int iFanin3;
  int k3;
  int *pFanins2;
  int iFanin2;
  int k2;
  int *pFanins;
  int iFanin;
  int k;
  int status;
  int nSuppNew;
  Vec_Int_t *vWin_local;
  int nDivs_local;
  int nVars_local;
  sat_solver *pSat_local;
  int Pivot_local;
  Acb_Ntk_t *p_local;
  
  if (fDelay == 0) {
    pFanins._4_4_ = 0;
    piVar5 = Acb_ObjFanins(p,Pivot);
    for (; pFanins._4_4_ < *piVar5; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar1 = piVar5[pFanins._4_4_ + 1];
      iVar3 = Acb_ObjIsAreaCritical(p,iVar1);
      if (iVar3 != 0) {
        pFanins2._4_4_ = 0;
        piVar6 = Acb_ObjFanins(p,Pivot);
        for (; pFanins2._4_4_ < *piVar6; pFanins2._4_4_ = pFanins2._4_4_ + 1) {
          iVar3 = piVar6[pFanins2._4_4_ + 1];
          iVar4 = Acb_ObjIsAreaCritical(p,iVar3);
          if ((iVar4 != 0) && (pFanins2._4_4_ != pFanins._4_4_)) {
            if (iVar1 == iVar3) {
              __assert_fail("iFanin != iFanin2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                            ,0x400,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            Vec_IntClear(vSupp);
            pFanins3._4_4_ = 0;
            piVar7 = Acb_ObjFanins(p,Pivot);
            for (; pFanins3._4_4_ < *piVar7; pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              iVar4 = piVar7[pFanins3._4_4_ + 1];
              if ((iVar4 != iVar1) && (iVar4 != iVar3)) {
                iVar2 = Acb_ObjFunc(p,iVar4);
                if (iVar2 < 0) {
                  __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                ,0x407,
                                "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                               );
                }
                iVar4 = Acb_ObjFunc(p,iVar4);
                iVar4 = Abc_Var2Lit(iVar4 + nVars * 6,0);
                Vec_IntPush(vSupp,iVar4);
              }
            }
            Vec_IntSize(vSupp);
            pFanins3._4_4_ = 0;
            piVar7 = Acb_ObjFanins(p,iVar1);
            for (; pFanins3._4_4_ < *piVar7; pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              iVar4 = piVar7[pFanins3._4_4_ + 1];
              iVar2 = Acb_ObjFunc(p,iVar4);
              if (iVar2 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x40f,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar4 = Acb_ObjFunc(p,iVar4);
              iVar4 = Abc_Var2Lit(iVar4 + nVars * 6 + nDivs,0);
              Vec_IntPush(vSupp,iVar4);
            }
            pFanins3._4_4_ = 0;
            piVar7 = Acb_ObjFanins(p,iVar3);
            for (; pFanins3._4_4_ < *piVar7; pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              iVar3 = piVar7[pFanins3._4_4_ + 1];
              iVar4 = Acb_ObjFunc(p,iVar3);
              if (iVar4 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x415,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar3 = Acb_ObjFunc(p,iVar3);
              iVar3 = Abc_Var2Lit(iVar3 + nVars * 6 + nDivs,0);
              Vec_IntPushUnique(vSupp,iVar3);
            }
            iVar3 = Vec_IntCheckUniqueSmall(vSupp);
            if (iVar3 == 0) {
              __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                            ,0x418,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            piVar7 = Vec_IntArray(vSupp);
            piVar8 = Vec_IntLimit(vSupp);
            iVar3 = sat_solver_solve(pSat,piVar7,piVar8,0,0,0,0);
            if (iVar3 == -1) {
              piVar7 = Vec_IntArray(vSupp);
              iVar3 = Vec_IntSize(vSupp);
              iVar3 = sat_solver_minimize_assumptions(pSat,piVar7,iVar3,0);
              Vec_IntShrink(vSupp,iVar3);
              Vec_IntLits2Vars(vSupp,nVars * -6);
              Vec_IntSort(vSupp,1);
              local_74 = 0;
              for (pFanins3._4_4_ = 0; iVar3 = Vec_IntSize(vSupp), pFanins3._4_4_ < iVar3;
                  pFanins3._4_4_ = pFanins3._4_4_ + 1) {
                iVar3 = Vec_IntEntry(vSupp,pFanins3._4_4_);
                if (iVar3 < nDivs) {
                  local_74 = local_74 + 1;
                }
                else {
                  Vec_IntWriteEntry(vSupp,pFanins3._4_4_,iVar3 - nDivs);
                }
              }
              if (local_74 != 0) {
                if (local_74 < 1) {
                  __assert_fail("NodeMark > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                ,0x431,
                                "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                               );
                }
                iVar3 = Vec_IntSize(vSupp);
                if (iVar3 - local_74 <= nLutSize) {
                  return local_74;
                }
              }
            }
          }
        }
      }
    }
    pFanins._4_4_ = 0;
    piVar5 = Acb_ObjFanins(p,Pivot);
    for (; pFanins._4_4_ < *piVar5; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar1 = piVar5[pFanins._4_4_ + 1];
      iVar3 = Acb_ObjIsAreaCritical(p,iVar1);
      if (iVar3 != 0) {
        pFanins2._4_4_ = 0;
        piVar6 = Acb_ObjFanins(p,iVar1);
        for (; pFanins2._4_4_ < *piVar6; pFanins2._4_4_ = pFanins2._4_4_ + 1) {
          iVar3 = piVar6[pFanins2._4_4_ + 1];
          iVar4 = Acb_ObjIsAreaCritical(p,iVar3);
          if (iVar4 != 0) {
            if (iVar1 == iVar3) {
              __assert_fail("iFanin != iFanin2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                            ,0x441,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            Vec_IntClear(vSupp);
            pFanins3._4_4_ = 0;
            piVar7 = Acb_ObjFanins(p,Pivot);
            for (; pFanins3._4_4_ < *piVar7; pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              iVar4 = piVar7[pFanins3._4_4_ + 1];
              if ((iVar4 != iVar1) && (iVar4 != iVar3)) {
                iVar4 = Acb_ObjFunc(p,iVar4);
                iVar4 = Abc_Var2Lit(iVar4 + nVars * 6,0);
                Vec_IntPush(vSupp,iVar4);
              }
            }
            Vec_IntSize(vSupp);
            pFanins3._4_4_ = 0;
            piVar7 = Acb_ObjFanins(p,iVar1);
            for (; pFanins3._4_4_ < *piVar7; pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              if (piVar7[pFanins3._4_4_ + 1] != iVar3) {
                iVar4 = Acb_ObjFunc(p,piVar7[pFanins3._4_4_ + 1]);
                iVar4 = Abc_Var2Lit(iVar4 + nVars * 6 + nDivs,0);
                Vec_IntPush(vSupp,iVar4);
              }
            }
            pFanins3._4_4_ = 0;
            piVar7 = Acb_ObjFanins(p,iVar3);
            for (; pFanins3._4_4_ < *piVar7; pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              iVar3 = piVar7[pFanins3._4_4_ + 1];
              iVar4 = Acb_ObjFunc(p,iVar3);
              if (iVar4 < 0) {
                __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x451,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar3 = Acb_ObjFunc(p,iVar3);
              iVar3 = Abc_Var2Lit(iVar3 + nVars * 6 + nDivs,0);
              Vec_IntPushUnique(vSupp,iVar3);
            }
            iVar3 = Vec_IntCheckUniqueSmall(vSupp);
            if (iVar3 == 0) {
              __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                            ,0x454,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            piVar7 = Vec_IntArray(vSupp);
            piVar8 = Vec_IntLimit(vSupp);
            iVar3 = sat_solver_solve(pSat,piVar7,piVar8,0,0,0,0);
            if (iVar3 != -1) {
              printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
              __assert_fail("status == l_False",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                            ,0x45d,
                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                           );
            }
            piVar7 = Vec_IntArray(vSupp);
            iVar3 = Vec_IntSize(vSupp);
            iVar3 = sat_solver_minimize_assumptions(pSat,piVar7,iVar3,0);
            Vec_IntShrink(vSupp,iVar3);
            Vec_IntLits2Vars(vSupp,nVars * -6);
            Vec_IntSort(vSupp,1);
            local_74 = 0;
            for (pFanins3._4_4_ = 0; iVar3 = Vec_IntSize(vSupp), pFanins3._4_4_ < iVar3;
                pFanins3._4_4_ = pFanins3._4_4_ + 1) {
              iVar3 = Vec_IntEntry(vSupp,pFanins3._4_4_);
              if (iVar3 < nDivs) {
                local_74 = local_74 + 1;
              }
              else {
                Vec_IntWriteEntry(vSupp,pFanins3._4_4_,iVar3 - nDivs);
              }
            }
            if (local_74 != 0) {
              if (local_74 < 1) {
                __assert_fail("NodeMark > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                              ,0x46e,
                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                             );
              }
              iVar3 = Vec_IntSize(vSupp);
              if (iVar3 - local_74 <= nLutSize) {
                return local_74;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Acb_NtkFindSupp3( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2, k3, iFanin3, * pFanins3, NodeMark;

    if ( fDelay )
        return 0;

    // iterate through pairs of fanins with one fanouts
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) || k2 == k )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                {
                    assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
                }
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                continue;
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 1 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    // iterate through fanins with one fanout and their fanins with one fanout
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            //Sat_SolverWriteDimacs( pSat, NULL, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0 );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check at node %d.\n", Pivot );
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 2 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    return 0;
}